

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O1

Order * __thiscall Market::find(Market *this,Side side,string *id)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  _Rb_tree_header *p_Var6;
  Order *unaff_R15;
  bool bVar7;
  
  if (side == sell) {
    p_Var4 = (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->m_askOrders)._M_t._M_impl.super__Rb_tree_header;
    bVar7 = (_Rb_tree_header *)p_Var4 == p_Var6;
    if (!bVar7) {
      p_Var1 = (_Base_ptr)id->_M_string_length;
      do {
        unaff_R15 = (Order *)&p_Var4[1]._M_parent;
        p_Var2 = p_Var4[1]._M_left;
        if ((p_Var2 == p_Var1) &&
           ((p_Var2 == (_Base_ptr)0x0 ||
            (iVar3 = bcmp(*(_Base_ptr *)unaff_R15,(id->_M_dataplus)._M_p,(size_t)p_Var2), iVar3 == 0
            )))) break;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        bVar7 = (_Rb_tree_header *)p_Var4 == p_Var6;
      } while (!bVar7);
    }
  }
  else {
    if (side != buy) goto LAB_001405a6;
    p_Var4 = (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header;
    bVar7 = (_Rb_tree_header *)p_Var4 == p_Var6;
    if (!bVar7) {
      p_Var1 = (_Base_ptr)id->_M_string_length;
      do {
        unaff_R15 = (Order *)&p_Var4[1]._M_parent;
        p_Var2 = p_Var4[1]._M_left;
        if ((p_Var2 == p_Var1) &&
           ((p_Var2 == (_Base_ptr)0x0 ||
            (iVar3 = bcmp(*(_Base_ptr *)unaff_R15,(id->_M_dataplus)._M_p,(size_t)p_Var2), iVar3 == 0
            )))) break;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        bVar7 = (_Rb_tree_header *)p_Var4 == p_Var6;
      } while (!bVar7);
    }
  }
  if (!bVar7) {
    return unaff_R15;
  }
LAB_001405a6:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = FIX::DoubleConvertor::fast_fixed_dtoa;
  __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Order &Market::find(Order::Side side, std::string id) {
  if (side == Order::buy) {
    BidOrders::iterator i;
    for (i = m_bidOrders.begin(); i != m_bidOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        return i->second;
      }
    }
  } else if (side == Order::sell) {
    AskOrders::iterator i;
    for (i = m_askOrders.begin(); i != m_askOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        return i->second;
      }
    }
  }
  throw std::exception();
}